

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bulk.c
# Opt level: O2

void ecs_bulk_delete(ecs_world_t *world,ecs_filter_t *filter)

{
  ecs_vector_t *vector;
  _Bool _Var1;
  int32_t iVar2;
  uint uVar3;
  ecs_stage_t *peVar4;
  ecs_table_t *table;
  ecs_data_t *peVar5;
  void *pvVar6;
  ulong uVar7;
  ecs_filter_t *filter_00;
  char *__assertion;
  int dense_index;
  ecs_world_t *local_40;
  ecs_filter_t *local_38;
  
  local_40 = world;
  local_38 = filter;
  _ecs_assert(world != (ecs_world_t *)0x0,2,(char *)0x0,"world != NULL",
              "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
              ,0xd);
  if (world == (ecs_world_t *)0x0) {
    __assertion = "world != ((void*)0)";
    uVar3 = 0xd;
  }
  else {
    peVar4 = ecs_get_stage(&local_40);
    _ecs_assert(peVar4 == &local_40->stage,0x23,(char *)0x0,"stage == &world->stage",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,0xf);
    if (peVar4 == &local_40->stage) {
      iVar2 = ecs_sparse_count((local_40->store).tables);
      if (iVar2 < 1) {
        iVar2 = 0;
      }
      filter_00 = local_38;
      for (dense_index = 0; dense_index != iVar2; dense_index = dense_index + 1) {
        table = (ecs_table_t *)_ecs_sparse_get((local_40->store).tables,0x80,dense_index);
        if ((table->flags & 1) == 0) {
          _Var1 = ecs_table_match_filter(local_40,table,filter_00);
          if (_Var1) {
            peVar5 = ecs_table_get_data(table);
            if (peVar5 != (ecs_data_t *)0x0) {
              vector = peVar5->entities;
              uVar3 = ecs_vector_count(vector);
              pvVar6 = _ecs_vector_first(vector,8,0x10);
              if ((int)uVar3 < 1) {
                uVar3 = 0;
              }
              for (uVar7 = 0; uVar3 != uVar7; uVar7 = uVar7 + 1) {
                ecs_sparse_remove((local_40->store).entity_index,
                                  *(uint64_t *)((long)pvVar6 + uVar7 * 8));
              }
              ecs_table_clear(local_40,table);
              filter_00 = local_38;
            }
          }
        }
      }
      return;
    }
    __assertion = "stage == &world->stage";
    uVar3 = 0xf;
  }
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O2/flecs-clone-prefix/src/flecs-clone/src/addons/bulk.c"
                ,uVar3,"void bulk_delete(ecs_world_t *, const ecs_filter_t *, _Bool)");
}

Assistant:

void ecs_bulk_delete(
    ecs_world_t *world,
    const ecs_filter_t *filter)
{
    bulk_delete(world, filter, true);
}